

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_pwm_set_data(uint8_t channel,uint32_t data)

{
  uint32_t data_local;
  uint8_t channel_local;
  
  if ((bcm2835_clk != (uint32_t *)0xffffffffffffffff) &&
     (bcm2835_pwm != (uint32_t *)0xffffffffffffffff)) {
    if (channel == '\0') {
      bcm2835_peri_write_nb(bcm2835_pwm + 5,data);
    }
    else if (channel == '\x01') {
      bcm2835_peri_write_nb(bcm2835_pwm + 9,data);
    }
  }
  return;
}

Assistant:

void bcm2835_pwm_set_data(uint8_t channel, uint32_t data)
{
  if (   bcm2835_clk == MAP_FAILED
       || bcm2835_pwm == MAP_FAILED)
    return; /* bcm2835_init() failed or not root */

  if (channel == 0)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM0_DATA, data);
  else if (channel == 1)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM1_DATA, data);
}